

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_ws_on_close_handler(ws_context_t *ctx,ws_session_t *session)

{
  char local_1a [2];
  ws_session_t *pwStack_18;
  uchar status [2];
  ws_session_t *session_local;
  ws_context_t *ctx_local;
  
  session->flags = session->flags | 2;
  local_1a[0] = '\x03';
  pwStack_18 = session;
  if ((ctx == (ws_context_t *)0x0) || ((ctx->frame).payload_length != 0)) {
    local_1a[1] = 0xe8;
    nh_ws_emit(session,2,local_1a,'\b');
  }
  else {
    local_1a[1] = 0xed;
    nh_ws_emit(session,2,local_1a,'\b');
  }
  return;
}

Assistant:

void nh_ws_on_close_handler(ws_context_t *ctx, ws_session_t *session) {
    FLAG_SET(session->flags, WEBSOCKET_SESSION_CLOSE);
    unsigned char status[2];
    status[0] = 0x03;
    if (ctx == NULL || ctx->frame.payload_length > 0) {
        status[1] = 0xe8;
        nh_ws_emit(session, 2, (char *) status, WEBSOCKET_OP_CLOSE);
    } else {
        status[1] = 0xed;
        nh_ws_emit(session, 2, (char *) status, WEBSOCKET_OP_CLOSE);
    }
}